

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O0

reference __thiscall
jsoncons::jsonpath::detail::
identifier_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::evaluate(identifier_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *context,reference root,path_node_type *last,reference current,
          result_options options,error_code *ec)

{
  bool bVar1;
  __type_conflict1 _Var2;
  reference this_00;
  _Hash_node_base *p_Var3;
  size_t sVar4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar5;
  base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *this_01;
  error_code *ec_00;
  reference pbVar6;
  string_view_type *in_RCX;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_RDX;
  path_node_type *in_RSI;
  long in_RDI;
  object_iterator oVar7;
  iterator iVar8;
  type tVar9;
  pointer ptr_1;
  size_t count;
  string_view_type sv;
  pointer ptr;
  size_t index;
  type r;
  int64_t n;
  object_iterator it;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffd98;
  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
  *in_stack_fffffffffffffda0;
  result_options rVar10;
  string_view_type *in_stack_fffffffffffffda8;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffdb0;
  path_node_type *ppVar11;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffdb8;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffdc0;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *context_00;
  base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffdc8;
  semantic_tag *in_stack_fffffffffffffdd0;
  conv_flags flags;
  unsigned_long *in_stack_fffffffffffffdd8;
  allocator<char> *args;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffde0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  string_view_type *in_stack_fffffffffffffe08;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  _Hash_node_base *local_1b0;
  allocator<char> local_142;
  undefined1 local_141;
  error_code *local_140;
  type_conflict2 local_138;
  string_view_type local_130;
  undefined1 local_120 [16];
  allocator<char> local_fa;
  undefined1 local_f9;
  __buckets_ptr local_f8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_f0;
  __node_base local_e8;
  char *local_e0;
  to_integer_errc local_d8;
  char *local_d0;
  to_integer_errc local_c8;
  _Hash_node_base *local_c0;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined1 local_a0;
  range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
  local_98;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_78;
  undefined1 local_70;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_68;
  undefined1 local_60;
  undefined1 local_58 [16];
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_48;
  undefined1 local_40;
  string_view_type *local_28;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *local_20;
  path_node_type *local_18;
  reference local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdb8);
  if (bVar1) {
    local_58 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(in_RDI + 0x20));
    oVar7 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::find_abi_cxx11_
                      (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    local_68 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)oVar7.it_._M_current;
    local_60 = oVar7.has_value_;
    local_48 = local_68;
    local_40 = local_60;
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
              (in_stack_fffffffffffffe40);
    iVar8 = range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
            ::end(&local_98);
    local_a8 = iVar8.it_._M_current;
    local_a0 = iVar8.has_value_;
    local_78 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)local_a8;
    local_70 = local_a0;
    bVar1 = jsoncons::detail::
            random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
            ::operator!=(in_stack_fffffffffffffda0,
                         (random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                          *)in_stack_fffffffffffffd98);
    rVar10 = (result_options)((ulong)in_stack_fffffffffffffda0 >> 0x20);
    if (bVar1) {
      local_b8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(in_RDI + 0x20))
      ;
      path_generator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
      ::generate(in_stack_fffffffffffffdb8,(path_node_type *)in_stack_fffffffffffffdb0,
                 in_stack_fffffffffffffda8,rVar10);
      this_00 = jsoncons::detail::
                random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                ::operator*((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                             *)0x5e3627);
      key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ::value(this_00);
      local_8 = base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                ::evaluate_tail(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                                (reference)in_stack_fffffffffffffdb8,
                                (path_node_type *)in_stack_fffffffffffffdb0,
                                (reference)in_stack_fffffffffffffda8,rVar10,
                                (error_code *)in_stack_fffffffffffffde0);
    }
    else {
      local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                ::null_value(in_stack_fffffffffffffdb0);
    }
  }
  else {
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       in_stack_fffffffffffffdb8);
    if (bVar1) {
      local_c0 = (_Hash_node_base *)0x0;
      std::__cxx11::string::data();
      std::__cxx11::string::size();
      tVar9 = jsoncons::detail::dec_to_integer<long,char>
                        ((char *)in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8,
                         (long *)in_stack_fffffffffffffdd0);
      local_e0 = tVar9.ptr;
      local_d8 = tVar9.ec;
      local_d0 = local_e0;
      local_c8 = local_d8;
      bVar1 = jsoncons::detail::to_integer_result::operator_cast_to_bool
                        ((to_integer_result *)&local_d0);
      if (bVar1) {
        if ((long)local_c0 < 0) {
          sVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             in_stack_fffffffffffffda8);
          local_1b0 = (_Hash_node_base *)((long)&local_c0->_M_nxt + sVar4);
        }
        else {
          local_1b0 = local_c0;
        }
        local_e8._M_nxt = local_1b0;
        p_Var3 = (_Hash_node_base *)
                 basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                           ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            in_stack_fffffffffffffda8);
        if (local_1b0 < p_Var3) {
          path_generator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
          ::generate(in_stack_fffffffffffffdb8,(path_node_type *)in_stack_fffffffffffffdb0,
                     (size_t)in_stack_fffffffffffffda8,
                     (result_options)((ulong)in_stack_fffffffffffffda0 >> 0x20));
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::operator[]
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     in_stack_fffffffffffffda0,(size_t)in_stack_fffffffffffffd98);
          local_8 = base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                    ::evaluate_tail(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                                    (reference)in_stack_fffffffffffffdb8,
                                    (path_node_type *)in_stack_fffffffffffffdb0,
                                    (reference)in_stack_fffffffffffffda8,
                                    (result_options)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                    (error_code *)in_stack_fffffffffffffde0);
        }
        else {
          local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                    ::null_value(in_stack_fffffffffffffdb0);
        }
      }
      else {
        eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
        ::length_label_abi_cxx11_
                  ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                    *)local_18);
        rVar10 = (result_options)((ulong)in_stack_fffffffffffffda0 >> 0x20);
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffdc0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffdb8);
        if ((_Var2) &&
           (sVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                               in_stack_fffffffffffffda8), sVar4 != 0)) {
          local_f8 = (__buckets_ptr)
                     basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                               ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                                in_stack_fffffffffffffda8);
          local_f9 = 0;
          eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
          ::get_allocator(in_stack_fffffffffffffd98);
          pbVar5 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                   ::create_json<unsigned_long,jsoncons::semantic_tag,std::allocator<char>>
                             (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                              in_stack_fffffffffffffdd0,(allocator<char> *)in_stack_fffffffffffffdc8
                             );
          std::allocator<char>::~allocator(&local_fa);
          local_f0 = pbVar5;
          local_120 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)(in_RDI + 0x20));
          path_generator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
          ::generate(in_stack_fffffffffffffdb8,(path_node_type *)in_stack_fffffffffffffdb0,
                     in_stack_fffffffffffffda8,rVar10);
          local_8 = base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                    ::evaluate_tail(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                                    (reference)in_stack_fffffffffffffdb8,
                                    (path_node_type *)in_stack_fffffffffffffdb0,
                                    (reference)in_stack_fffffffffffffda8,rVar10,
                                    (error_code *)in_stack_fffffffffffffde0);
        }
        else {
          local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                    ::null_value(in_stack_fffffffffffffdb0);
        }
      }
    }
    else {
      bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         in_stack_fffffffffffffdb8);
      flags = (conv_flags)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
      if (bVar1) {
        eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
        ::length_label_abi_cxx11_
                  ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                    *)local_18);
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffdc0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffdb8);
        if (_Var2) {
          local_130 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                      as_string_view(in_stack_fffffffffffffe00);
          context_00 = (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                        *)&local_130;
          this_01 = (base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                     *)std::basic_string_view<char,_std::char_traits<char>_>::data
                                 ((basic_string_view<char,_std::char_traits<char>_> *)context_00);
          std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)context_00);
          local_138 = unicode_traits::count_codepoints<char>
                                ((char *)in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8
                                 ,flags);
          local_141 = 0;
          args = &local_142;
          ppVar11 = local_18;
          eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
          ::get_allocator(in_stack_fffffffffffffd98);
          ec_00 = (error_code *)
                  eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                  ::create_json<unsigned_long&,jsoncons::semantic_tag,std::allocator<char>>
                            (in_stack_fffffffffffffde0,(unsigned_long *)args,(semantic_tag *)ppVar11
                             ,(allocator<char> *)this_01);
          std::allocator<char>::~allocator(&local_142);
          ppVar11 = local_18;
          local_140 = ec_00;
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)(in_RDI + 0x20));
          rVar10 = (result_options)((ulong)local_18 >> 0x20);
          path_generator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
          ::generate(local_20,ppVar11,local_28,rVar10);
          pbVar6 = base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                   ::evaluate_tail(this_01,context_00,(reference)local_20,ppVar11,
                                   (reference)local_28,rVar10,ec_00);
          return pbVar6;
        }
      }
      local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                ::null_value(in_stack_fffffffffffffdb0);
    }
  }
  return local_8;
}

Assistant:

reference evaluate(eval_context<Json,JsonReference>& context,
                           reference root,
                           const path_node_type& last, 
                           reference current, 
                           result_options options,
                           std::error_code& ec) const override
        {
            if (current.is_object())
            {
                auto it = current.find(identifier_);
                if (it != current.object_range().end())
                {
                    return this->evaluate_tail(context, root, 
                                               path_generator_type::generate(context, last, identifier_, options),
                                              (*it).value(), options, ec);
                }
                return context.null_value();
            }
            if (current.is_array())
            {
                int64_t n{0};
                auto r = jsoncons::detail::dec_to_integer(identifier_.data(), identifier_.size(), n);
                if (r)
                {
                    auto index = (n >= 0) ? static_cast<std::size_t>(n) : static_cast<std::size_t>(static_cast<int64_t>(current.size()) + n);
                    if (index < current.size())
                    {
                        return this->evaluate_tail(context, root, 
                                                   path_generator_type::generate(context, last, index, options),
                                                   current[index], options, ec);
                    }
                    return context.null_value();
                }
                if (identifier_ == context.length_label() && current.size() > 0)
                {
                    pointer ptr = context.create_json(current.size(), semantic_tag::none, context.get_allocator());
                    return this->evaluate_tail(context, root, 
                                               path_generator_type::generate(context, last, identifier_, options), 
                                               *ptr, 
                                               options, ec);
                }
                return context.null_value();
            }
            if (current.is_string() && identifier_ == context.length_label())
            {
                string_view_type sv = current.as_string_view();
                std::size_t count = unicode_traits::count_codepoints(sv.data(), sv.size());
                pointer ptr = context.create_json(count, semantic_tag::none, context.get_allocator());
                return this->evaluate_tail(context, root, 
                                           path_generator_type::generate(context, last, identifier_, options), 
                                           *ptr, options, ec);
            }
            return context.null_value();
        }